

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

ssize_t __thiscall
sc_core::vcd_sc_fxnum_fast_trace::write
          (vcd_sc_fxnum_fast_trace *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  vector<char,_std::allocator<char>_> *this_00;
  sc_fxnum_fast *psVar3;
  reference __s;
  undefined4 in_register_00000034;
  int bitindex;
  char *rawdata_ptr;
  size_t sz;
  sc_fxnum_fast *in_stack_ffffffffffffff30;
  allocator_type *in_stack_ffffffffffffff38;
  allocator_type *__a;
  sc_fxnum_fast *in_stack_ffffffffffffff40;
  sc_fxnum_fast *in_stack_ffffffffffffff48;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff58;
  vcd_trace *in_stack_ffffffffffffff60;
  int local_7c;
  char *local_78;
  allocator_type local_6a;
  undefined1 local_69;
  undefined1 local_4a [36];
  allocator<char> local_26;
  bool local_25;
  undefined1 local_12 [18];
  
  local_12._2_8_ = CONCAT44(in_register_00000034,__fd);
  local_12._10_8_ = this;
  if (write(_IO_FILE*)::compdata == '\0') {
    iVar2 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata);
    if (iVar2 != 0) {
      local_12[1] = 0;
      in_stack_ffffffffffffff60 = (vcd_trace *)local_12;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
                 (value_type_conflict *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::allocator<char>::~allocator((allocator<char> *)local_12);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle)
      ;
      __cxa_guard_release(&write(_IO_FILE*)::compdata);
    }
  }
  if (write(_IO_FILE*)::rawdata == '\0') {
    iVar2 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata);
    if (iVar2 != 0) {
      local_25 = false;
      in_stack_ffffffffffffff58 = &local_26;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48,
                 (value_type_conflict *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::allocator<char>::~allocator(&local_26);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::rawdata);
    }
  }
  this_00 = (vector<char,_std::allocator<char>_> *)
            std::vector<char,_std::allocator<char>_>::size(&write::compdata);
  iVar2 = sc_dt::sc_fxnum_fast::wl((sc_fxnum_fast *)0x2d7154);
  if (this_00 <= (vector<char,_std::allocator<char>_> *)(long)iVar2) {
    iVar2 = sc_dt::sc_fxnum_fast::wl((sc_fxnum_fast *)0x2d7175);
    in_stack_ffffffffffffff40 = (sc_fxnum_fast *)((long)iVar2 + 0x1000U & 0xfffffffffffff000);
    local_4a[1] = 0;
    in_stack_ffffffffffffff48 = (sc_fxnum_fast *)local_4a;
    local_4a._26_8_ = in_stack_ffffffffffffff40;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (this_00,(size_type)in_stack_ffffffffffffff48,
               (value_type_conflict *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::vector<char,_std::allocator<char>_>::swap
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff40,
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff38);
    std::vector<char,_std::allocator<char>_>::~vector(this_00);
    std::allocator<char>::~allocator((allocator<char> *)local_4a);
    local_69 = 0;
    __a = &local_6a;
    in_stack_ffffffffffffff30 = (sc_fxnum_fast *)local_4a._26_8_;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (this_00,(size_type)in_stack_ffffffffffffff48,
               (value_type_conflict *)in_stack_ffffffffffffff40,__a);
    std::vector<char,_std::allocator<char>_>::swap
              ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff40,
               (vector<char,_std::allocator<char>_> *)__a);
    std::vector<char,_std::allocator<char>_>::~vector(this_00);
    std::allocator<char>::~allocator(&local_6a);
  }
  local_78 = std::vector<char,_std::allocator<char>_>::operator[](&write::rawdata,0);
  local_7c = sc_dt::sc_fxnum_fast::wl((sc_fxnum_fast *)0x2d738d);
  while (local_7c = local_7c + -1, -1 < local_7c) {
    sc_dt::sc_fxnum_fast::operator[]
              (in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    bVar1 = sc_dt::sc_fxnum_fast_bitref_r::operator_cast_to_bool((sc_fxnum_fast_bitref_r *)0x2d73bc)
    ;
    *local_78 = "01"[bVar1];
    local_78 = local_78 + 1;
  }
  *local_78 = '\0';
  psVar3 = (sc_fxnum_fast *)std::vector<char,_std::allocator<char>_>::operator[](&write::rawdata,0);
  std::vector<char,_std::allocator<char>_>::operator[](&write::compdata,0);
  vcd_trace::compose_data_line
            (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,(char *)this_00);
  __s = std::vector<char,_std::allocator<char>_>::operator[](&write::compdata,0);
  fputs(__s,(FILE *)local_12._2_8_);
  psVar3 = sc_dt::sc_fxnum_fast::operator=(in_stack_ffffffffffffff30,psVar3);
  return (ssize_t)psVar3;
}

Assistant:

void
vcd_sc_fxnum_fast_trace::write( FILE* f )
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.wl()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.wl()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for(int bitindex = object.wl() - 1; bitindex >= 0; -- bitindex )
    {
        *rawdata_ptr ++ = "01"[object[bitindex]];
    }
    *rawdata_ptr = '\0';
    compose_data_line( &rawdata[0], &compdata[0] );

    std::fputs( &compdata[0], f );
    old_value = object;
}